

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int push_psbt_output(uchar **cursor,size_t *max,wally_psbt_output *output)

{
  wally_psbt_output *output_local;
  size_t *max_local;
  uchar **cursor_local;
  
  push_typed_varbuff(cursor,max,0,output->redeem_script,output->redeem_script_len);
  push_typed_varbuff(cursor,max,1,output->witness_script,output->witness_script_len);
  push_typed_map(cursor,max,2,&output->keypaths);
  push_elements_varbuff(cursor,max,0,output->value_commitment,output->value_commitment_len);
  push_elements_varbuff(cursor,max,1,output->vbf,output->vbf_len);
  push_elements_varbuff(cursor,max,2,output->asset_commitment,output->asset_commitment_len);
  push_elements_varbuff(cursor,max,3,output->abf,output->abf_len);
  push_elements_varbuff(cursor,max,4,output->rangeproof,output->rangeproof_len);
  push_elements_varbuff(cursor,max,5,output->surjectionproof,output->surjectionproof_len);
  push_elements_varbuff(cursor,max,6,output->blinding_pubkey,output->blinding_pubkey_len);
  push_elements_varbuff(cursor,max,7,output->nonce,output->nonce_len);
  push_map(cursor,max,&output->unknowns);
  push_u8(cursor,max,'\0');
  return 0;
}

Assistant:

static int push_psbt_output(unsigned char **cursor, size_t *max,
                            const struct wally_psbt_output *output)
{
    /* Redeem script */
    push_typed_varbuff(cursor, max, PSBT_OUT_REDEEM_SCRIPT,
                       output->redeem_script, output->redeem_script_len);
    /* Witness script */
    push_typed_varbuff(cursor, max, PSBT_OUT_WITNESS_SCRIPT,
                       output->witness_script, output->witness_script_len);
    /* Keypaths */
    push_typed_map(cursor, max, PSBT_OUT_BIP32_DERIVATION, &output->keypaths);

#ifdef BUILD_ELEMENTS
    push_elements_varbuff(cursor, max, PSET_OUT_VALUE_COMMITMENT,
                          output->value_commitment, output->value_commitment_len);
    push_elements_varbuff(cursor, max, PSET_OUT_VALUE_BLINDER,
                          output->vbf, output->vbf_len);
    push_elements_varbuff(cursor, max, PSET_OUT_ASSET_COMMITMENT,
                          output->asset_commitment, output->asset_commitment_len);
    push_elements_varbuff(cursor, max, PSET_OUT_ASSET_BLINDER,
                          output->abf, output->abf_len);
    push_elements_varbuff(cursor, max, PSET_OUT_RANGE_PROOF,
                          output->rangeproof, output->rangeproof_len);
    push_elements_varbuff(cursor, max, PSET_OUT_SURJECTION_PROOF,
                          output->surjectionproof, output->surjectionproof_len);
    push_elements_varbuff(cursor, max, PSET_OUT_BLINDING_PUBKEY,
                          output->blinding_pubkey, output->blinding_pubkey_len);
    push_elements_varbuff(cursor, max, PSET_OUT_NONCE_COMMITMENT,
                          output->nonce, output->nonce_len);
#endif /* BUILD_ELEMENTS */
    /* Unknowns */
    push_map(cursor, max, &output->unknowns);
    /* Separator */
    push_u8(cursor, max, PSBT_SEPARATOR);
    return WALLY_OK;
}